

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testLoadUnstructured.hpp
# Opt level: O3

void testApproxL2<makeTests(TasGrid::TypeAcceleration,int)::__16>
               (TasmanianSparseGrid *grid,uint param_2)

{
  _Head_base<0UL,_TasGrid::BaseCanonicalGrid_*,_false> _Var1;
  undefined8 uVar2;
  pointer pdVar3;
  TasmanianSparseGrid *pTVar4;
  ostream *poVar5;
  runtime_error *this;
  ulong uVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  double dVar10;
  double dVar11;
  initializer_list<double> __l;
  initializer_list<double> __l_00;
  vector<double,_std::allocator<double>_> surrogate;
  vector<double,_std::allocator<double>_> transform_b;
  vector<double,_std::allocator<double>_> transform_a;
  minstd_rand park_miller;
  allocator_type local_139;
  _Any_data local_138;
  pointer local_128;
  double local_110;
  vector<double,_std::allocator<double>_> local_108;
  vector<double,_std::allocator<double>_> local_e8;
  vector<double,_std::allocator<double>_> local_d0;
  TasmanianSparseGrid *local_b0;
  _Any_data local_a8;
  code *local_98;
  code *local_90;
  vector<double,_std::allocator<double>_> local_88;
  vector<double,_std::allocator<double>_> local_68;
  double local_50;
  undefined4 local_48;
  undefined4 uStack_44;
  undefined4 uStack_40;
  undefined4 uStack_3c;
  
  local_138._M_unused._M_object = (void *)0xbfe0000000000000;
  local_138._8_8_ = (_func_void *)0xbfe0000000000000;
  local_128 = (pointer)0xbfe0000000000000;
  __l._M_len = 3;
  __l._M_array = (iterator)&local_138;
  std::vector<double,_std::allocator<double>_>::vector(&local_e8,__l,(allocator_type *)&local_88);
  local_68.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x3fe6666666666666;
  local_68.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x3fe6666666666666;
  local_68.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x3fe6666666666666;
  __l_00._M_len = 3;
  __l_00._M_array = (iterator)&local_68;
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)&local_a8,__l_00,
             (allocator_type *)&local_108);
  TasGrid::TasmanianSparseGrid::setDomainTransform((vector *)grid,(vector *)&local_e8);
  if (local_a8._M_unused._M_object != (void *)0x0) {
    operator_delete(local_a8._M_unused._M_object,(long)local_98 - local_a8._0_8_);
  }
  if (local_e8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_e8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_e8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_e8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  _Var1._M_head_impl =
       (grid->base)._M_t.
       super___uniq_ptr_impl<TasGrid::BaseCanonicalGrid,_std::default_delete<TasGrid::BaseCanonicalGrid>_>
       ._M_t.
       super__Tuple_impl<0UL,_TasGrid::BaseCanonicalGrid_*,_std::default_delete<TasGrid::BaseCanonicalGrid>_>
       .super__Head_base<0UL,_TasGrid::BaseCanonicalGrid_*,_false>._M_head_impl;
  if (_Var1._M_head_impl == (BaseCanonicalGrid *)0x0) {
    lVar8 = 0;
    lVar9 = 0;
  }
  else {
    lVar8 = (long)*(int *)(_Var1._M_head_impl + 0x10);
    lVar9 = (long)*(int *)(_Var1._M_head_impl + 0x14);
  }
  local_68.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_68.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_68.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_88.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_88.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_88.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  TasGrid::TasmanianSparseGrid::getDomainTransform((vector *)grid,(vector *)&local_68);
  local_a8._8_8_ = &local_50;
  local_50 = 2.07507571253324e-322;
  local_a8._M_unused._M_object = &local_48;
  local_48 = 0;
  uStack_44 = 0;
  uStack_40 = 0;
  uStack_3c = 0x3ff00000;
  local_90 = std::
             _Function_handler<double_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/mkstoyanov[P]TASMANIAN/Addons/testLoadUnstructured.hpp:74:81)>
             ::_M_invoke;
  local_98 = std::
             _Function_handler<double_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/mkstoyanov[P]TASMANIAN/Addons/testLoadUnstructured.hpp:74:81)>
             ::_M_manager;
  local_108.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_108.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_108.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  std::function<double_()>::function
            ((function<double_()> *)&local_138,(function<double_()> *)&local_a8);
  TasDREAM::genUniformSamples
            (&local_68,&local_88,param_2,&local_108,(function<double_()> *)&local_138);
  if (local_128 != (pointer)0x0) {
    (*(code *)local_128)(&local_138,&local_138,3);
  }
  if (local_98 != (code *)0x0) {
    (*local_98)(&local_a8,&local_a8,3);
  }
  local_b0 = grid;
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)&local_138,(int)param_2 * lVar9,&local_139);
  if (0 < (int)param_2) {
    uVar6 = (ulong)param_2;
    local_110 = (double)(lVar9 << 3);
    lVar7 = 0x10;
    lVar9 = 0x10;
    do {
      pdVar3 = local_108.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
      uVar2 = local_138._M_unused._0_8_;
      dVar11 = *(double *)
                ((long)local_108.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_start + lVar7 + -8) + -0.3;
      dVar11 = exp((*(double *)
                     ((long)local_108.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_start + lVar7) + 0.4) *
                   -(*(double *)
                      ((long)local_108.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                             super__Vector_impl_data._M_start + lVar7 + -0x10) + -0.1) * dVar11 *
                   dVar11);
      *(double *)(uVar2 + lVar9 + -0x10) = dVar11;
      dVar11 = exp((*(double *)((long)pdVar3 + lVar7) + 0.3) *
                   (*(double *)((long)pdVar3 + lVar7 + -8) + -0.2) *
                   -(*(double *)((long)pdVar3 + lVar7 + -0x10) + -0.1));
      dVar10 = local_110;
      *(double *)(uVar2 + lVar9 + -8) = dVar11;
      dVar11 = exp((*(double *)((long)pdVar3 + lVar7) + -0.1) *
                   (*(double *)((long)pdVar3 + lVar7 + -8) + 0.1) *
                   -(*(double *)((long)pdVar3 + lVar7 + -0x10) + 0.3));
      *(double *)(uVar2 + lVar9) = dVar11;
      lVar9 = lVar9 + (long)dVar10;
      lVar7 = lVar7 + lVar8 * 8;
      uVar6 = uVar6 - 1;
    } while (uVar6 != 0);
  }
  local_e8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = local_108.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
  local_e8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = local_108.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_finish;
  local_e8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage =
       local_108.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
       ._M_end_of_storage;
  local_d0.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)local_138._M_unused._0_8_;
  local_d0.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)local_138._8_8_;
  local_d0.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = local_128;
  if (local_88.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_88.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_88.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_88.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_68.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_68.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_68.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_68.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  pTVar4 = local_b0;
  TasGrid::loadUnstructuredDataL2(&local_e8,&local_d0,1e-08,local_b0);
  local_138._M_unused._M_object = (void *)0x0;
  local_138._8_8_ = 0;
  local_128 = (pointer)0x0;
  TasGrid::TasmanianSparseGrid::evaluateBatch<double>((vector *)pTVar4,(vector *)&local_e8);
  lVar8 = std::cout;
  if ((long)local_d0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_finish -
      (long)local_d0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start != local_138._8_8_ - local_138._0_8_) {
    dVar11 = 1e+20;
LAB_0010d4f7:
    *(uint *)(std::ostream::write + *(long *)(std::cout + -0x18)) =
         *(uint *)(std::ostream::write + *(long *)(std::cout + -0x18)) & 0xfffffefb | 0x100;
    *(undefined8 *)(&__cxxabiv1::__si_class_type_info::vtable + *(long *)(lVar8 + -0x18)) = 10;
    local_110 = dVar11;
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Failed approximate unstructured construction\n",0x2d);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Observed error: ",0x10);
    poVar5 = std::ostream::_M_insert<double>(local_110);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,"  tolerance: ",0xd);
    poVar5 = std::ostream::_M_insert<double>(0.0001);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\n",1);
    TasGrid::TasmanianSparseGrid::printStats((ostream *)local_b0);
    this = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this,"test failed");
    __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  if (local_d0.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_finish ==
      local_d0.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start) {
    if (local_138._M_unused._M_object == (void *)0x0) goto LAB_0010d4b1;
  }
  else {
    lVar9 = (long)local_d0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_finish -
            (long)local_d0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start >> 3;
    dVar11 = 0.0;
    lVar7 = 0;
    do {
      dVar10 = ABS(local_d0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start[lVar7] -
                   *(double *)((long)local_138._M_unused._0_8_ + lVar7 * 8));
      if (dVar11 <= dVar10) {
        dVar11 = dVar10;
      }
      lVar7 = lVar7 + 1;
    } while (lVar9 + (ulong)(lVar9 == 0) != lVar7);
    if (0.0001 < dVar11) goto LAB_0010d4f7;
  }
  operator_delete(local_138._M_unused._M_object,(long)local_128 - local_138._0_8_);
LAB_0010d4b1:
  if (local_d0.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_d0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_d0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_d0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_e8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_e8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_e8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_e8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void testApproxL2(TasmanianSparseGrid &&grid, CallableModel model, int num_samples, double tolerance){
    grid.setDomainTransform({-0.5, -0.5, -0.5,}, {0.7, 0.7, 0.7});

    auto data = generateRandomData(grid, model, num_samples);
    loadUnstructuredDataL2(data.first, data.second, 1.E-8, grid);

    std::vector<double> surrogate;
    grid.evaluateBatch(data.first, surrogate);

    double err = vecDifference(data.second, surrogate);
    if (err > tolerance){
        std::cout << std::scientific;
        std::cout.precision(10);
        cout << "Failed approximate unstructured construction\n";
        cout << "Observed error: " << err << "  tolerance: " << tolerance << "\n";
        grid.printStats();
        throw std::runtime_error("test failed");
    }
}